

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTimeAccess.cpp
# Opt level: O2

long __thiscall bhf::ads::RTimeAccess::SetSharedCores(RTimeAccess *this,uint32_t sharedCores)

{
  long lVar1;
  uint32_t sharedCores_local;
  AmsAddr systemService;
  RTimeCpuSettings oldSettings;
  
  sharedCores_local = sharedCores;
  ReadCpuSettings(&oldSettings,this);
  if (sharedCores == 0xffffffff) {
    if (oldSettings.nNonWinCPUs != 0) goto LAB_00127610;
  }
  else if (oldSettings.nWinCPUs != sharedCores) {
LAB_00127610:
    systemService.netId.b._4_2_ = *(undefined2 *)((this->device).m_Addr.netId.b + 4);
    systemService.netId.b._0_4_ = *(undefined4 *)(this->device).m_Addr.netId.b;
    systemService.port = 10000;
    lVar1 = AdsDevice::GetLocalPort(&this->device);
    lVar1 = AdsSyncWriteReqEx(lVar1,&systemService,0x4b0,0,4,&sharedCores_local);
    return lVar1;
  }
  std::operator<<((ostream *)&std::cout,
                  "Requested shared core configuration already active, no change applied.\n");
  return 0x70f;
}

Assistant:

long RTimeAccess::SetSharedCores(const uint32_t sharedCores) const
{
    const auto oldSettings = ReadCpuSettings();

    if (sharedCores == std::numeric_limits<uint32_t>::max()) {
        // 0xffffffff means RESET -> no isolated cores, all shared.
        if (0 == oldSettings.nNonWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    } else {
        // All other values mean limit the number of shared cores -> use remaining cores as isolated.
        if (sharedCores == oldSettings.nWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    }
    // We have to apply changes to the current core configuration. For this we
    // have to talk to a different AdsDevice, the system service. Now, it is handy
    // that ADS doesn't really implement "connections" so we can just use the AMS
    // port of our RTimeAccess object, but adust the target AmsPort.
    const AmsAddr systemService { device.m_Addr.netId, 10000 };
    return AdsSyncWriteReqEx(device.GetLocalPort(),
                             &systemService,
                             SYSTEMSERVICE_SETNUMPROC,
                             0,
                             sizeof(sharedCores),
                             &sharedCores);
}